

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<64U,_unsigned_short,_void,_true> __thiscall
math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_true>::operator-
          (uintwide_t<64U,_unsigned_short,_void,_true> *this)

{
  uintwide_t<64U,_unsigned_short,_void,_true> *this_local;
  uintwide_t<64U,_unsigned_short,_void,_true> tmp;
  
  this_local = *(uintwide_t<64U,_unsigned_short,_void,_true> **)
                (this->values).super_array<unsigned_short,_4UL>.elems;
  negate((uintwide_t<64U,_unsigned_short,_void,_true> *)&this_local);
  return (representation_type)(representation_type)this_local;
}

Assistant:

constexpr auto operator-() const ->       uintwide_t  { uintwide_t tmp(*this); tmp.negate(); return tmp; }